

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPU.cpp
# Opt level: O0

void __thiscall PPU::fetchLowTileByte(PPU *this)

{
  uint8_t uVar1;
  PPU *in_RDI;
  uint16_t addr;
  uint8_t tile;
  uint8_t table;
  uint8_t fineY;
  
  uVar1 = ReadRam(in_RDI,CONCAT11((char)((int)(uint)in_RDI->vramCur >> 0xc),
                                  (in_RDI->PPUCTRL & 0x10) != 0) & 0x7ff);
  in_RDI->lowTileByte = uVar1;
  return;
}

Assistant:

void PPU::fetchLowTileByte() {
    uint8_t fineY = ((vramCur >> 12) & 7);
    uint8_t table = (PPUCTRL & flagBackgroundTable) ? 1 : 0;
    uint8_t tile = nameTableByte;
    uint16_t addr = (0x1000 * table) + (tile * 0x10) + fineY;
    lowTileByte = ReadRam(addr);
}